

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# date_lookup_cache.hpp
# Opt level: O0

void __thiscall
duckdb::DateLookupCache<duckdb::DatePart::MonthOperator>::BuildCache
          (DateLookupCache<duckdb::DatePart::MonthOperator> *this)

{
  unsigned_short uVar1;
  long in;
  type puVar2;
  unique_ptr<unsigned_short[],_std::default_delete<unsigned_short>,_false> *in_RDI;
  long cache_entry;
  date_t date;
  int32_t d;
  undefined6 in_stack_ffffffffffffffc8;
  undefined2 in_stack_ffffffffffffffce;
  undefined4 in_stack_ffffffffffffffd8;
  undefined4 in_stack_ffffffffffffffdc;
  date_t local_18;
  int local_14;
  
  make_unsafe_uniq_array_uninitialized<unsigned_short>
            (CONCAT44(in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8));
  unique_ptr<unsigned_short[],_std::default_delete<unsigned_short>,_false>::operator=
            (in_RDI,(unique_ptr<unsigned_short[],_std::default_delete<unsigned_short>,_false> *)
                    CONCAT26(in_stack_ffffffffffffffce,in_stack_ffffffffffffffc8));
  unique_ptr<unsigned_short[],_std::default_delete<unsigned_short>,_false>::~unique_ptr
            ((unique_ptr<unsigned_short[],_std::default_delete<unsigned_short>,_false> *)0xcccfab);
  for (local_14 = 0; local_14 < 0x7390; local_14 = local_14 + 1) {
    date_t::date_t(&local_18,local_14);
    in = DatePart::MonthOperator::Operation<duckdb::date_t,long>((date_t)0x0);
    uVar1 = UnsafeNumericCast<unsigned_short,long,void>(in);
    GetDateCacheEntry((date_t)0x0);
    puVar2 = unique_ptr<unsigned_short[],_std::default_delete<unsigned_short>,_false>::operator[]
                       (in_RDI,CONCAT26(uVar1,in_stack_ffffffffffffffc8));
    *puVar2 = uVar1;
  }
  return;
}

Assistant:

void BuildCache() {
		D_ASSERT(CACHE_MAX_DATE > CACHE_MIN_DATE);
		cache = make_unsafe_uniq_array_uninitialized<CACHE_TYPE>(CACHE_MAX_DATE - CACHE_MIN_DATE);
		for (int32_t d = CACHE_MIN_DATE; d < CACHE_MAX_DATE; d++) {
			date_t date(d);
			auto cache_entry = OP::template Operation<date_t, int64_t>(date);
			cache[GetDateCacheEntry(date)] = UnsafeNumericCast<CACHE_TYPE>(cache_entry);
		}
	}